

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.cpp
# Opt level: O2

void __thiscall GNB::GNB(GNB *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_GNB = (_func_int **)&PTR__GNB_00109d98;
  p_Var1 = &(this->p_class_)._M_t._M_impl.super__Rb_tree_header;
  (this->p_class_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->p_class_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->p_class_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->p_class_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->p_class_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->f_stats_)._M_t._M_impl.super__Rb_tree_header;
  (this->f_stats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->f_stats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->f_stats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->f_stats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->f_stats_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->labels_list_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->labels_list_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->labels_list_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

GNB::GNB() {

}